

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O3

void __thiscall
argsman_tests::CheckValueTest::CheckValue(CheckValueTest *this,uint flags,char *arg,Expect *expect)

{
  optional<bool> *poVar1;
  pointer pcVar2;
  undefined1 *puVar3;
  VType VVar4;
  long lVar5;
  char *__s;
  bool bVar6;
  bool bVar7;
  int iVar8;
  size_t __n;
  long lVar9;
  iterator in_R8;
  iterator pvVar10;
  iterator in_R9;
  iterator pvVar11;
  long in_FS_OFFSET;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  check_type cVar12;
  char *local_718;
  char *local_710;
  undefined1 *local_708;
  undefined1 *local_700;
  char *local_6f8;
  char *local_6f0;
  char *local_6e8;
  char *local_6e0;
  undefined1 *local_6d8;
  undefined1 *local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  char *local_6b0;
  undefined1 *local_6a8;
  undefined1 *local_6a0;
  char *local_698;
  char *local_690;
  undefined1 *local_688;
  undefined1 *local_680;
  char *local_678;
  char *local_670;
  undefined1 *local_668;
  undefined1 *local_660;
  char *local_658;
  char *local_650;
  undefined1 *local_648;
  undefined1 *local_640;
  char *local_638;
  char *local_630;
  undefined1 *local_628;
  undefined1 *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  char *local_5c8;
  char *local_5c0;
  undefined1 *local_5b8;
  undefined1 *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  char *local_578;
  char *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  char *local_538;
  char *local_530;
  undefined1 *local_528;
  undefined1 *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  assertion_result local_408;
  char *local_3f0;
  vector<UniValue,_std::allocator<UniValue>_> settings_list;
  undefined1 local_3d0 [8];
  undefined1 local_3c8 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  l;
  undefined1 local_390 [32];
  undefined1 local_370 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_360;
  undefined1 local_350 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_328;
  vector<UniValue,_std::allocator<UniValue>_> local_310;
  undefined1 local_2f8 [32];
  undefined1 local_2d8 [24];
  undefined1 local_2c0 [8];
  string error;
  char *argv [2];
  TestArgsManager test;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager(&test.super_ArgsManager);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&test.super_ArgsManager.m_network_only_args._M_t);
  pcVar2 = local_350 + 0x10;
  local_350._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"-value","");
  __l._M_len = 1;
  __l._M_array = (iterator)local_350;
  local_338._8_4_ = flags;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)&l,__l,(allocator_type *)&local_408);
  TestArgsManager::SetupArgs
            (&test,(vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    *)&l);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)&l);
  if ((pointer)local_350._0_8_ != pcVar2) {
    operator_delete((void *)local_350._0_8_,local_350._16_8_ + 1);
  }
  argv[0] = "ignored";
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  argv[1] = arg;
  bVar6 = ArgsManager::ParseParameters
                    (&test.super_ArgsManager,2 - (uint)(arg == (char *)0x0),argv,&error);
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x77;
  file.m_begin = (iterator)&local_418;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_428,msg);
  local_2d8._8_8_ = local_2d8._8_8_ & 0xffffffffffffff00;
  local_2d8._0_8_ = &PTR__lazy_ostream_01388f08;
  local_2d8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2c0 = (undefined1  [8])((long)"\x05\x04\x03\x02\x01" + 5);
  local_370._0_8_ = local_370 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"-value","");
  ArgsManager::GetSetting((SettingsValue *)local_350,&test.super_ArgsManager,(string *)local_370);
  ::UniValue::write_abi_cxx11_((UniValue *)local_2f8,(int)local_350,(void *)0x0,0);
  ::UniValue::write_abi_cxx11_((UniValue *)local_390,(int)expect,(void *)0x0,0);
  if (local_2f8._8_8_ == local_390._8_8_) {
    if ((char *)local_2f8._8_8_ == (char *)0x0) {
      settings_list.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = true;
    }
    else {
      iVar8 = bcmp((void *)local_2f8._0_8_,(void *)local_390._0_8_,local_2f8._8_8_);
      settings_list.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = iVar8 == 0;
    }
  }
  else {
    settings_list.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  settings_list.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  settings_list.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_3c8._16_8_ = "";
  l.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)l.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  l.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388fc8;
  l.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_3f0 = local_3d0;
  local_3d0 = (undefined1  [8])local_390;
  local_408.m_message.px = (element_type *)((ulong)local_408.m_message.px & 0xffffffffffffff00);
  local_408._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_408.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar10 = (iterator)0x1;
  pvVar11 = (iterator)0x2;
  local_3c8._0_8_ = (UniValue *)local_2f8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&settings_list,(lazy_ostream *)local_2d8,1,2,REQUIRE,0xe36409,
             (size_t)(local_3c8 + 8),0x77,&l,"expect.setting.write()",&local_408);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &settings_list.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if ((pointer)local_390._0_8_ != (pointer)(local_390 + 0x10)) {
    operator_delete((void *)local_390._0_8_,(ulong)((long)(_func_int ***)local_390._16_8_ + 1));
  }
  if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
    operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_310);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._8_8_ != &local_338) {
    operator_delete((void *)local_350._8_8_,local_338._0_8_ + 1);
  }
  if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
    operator_delete((void *)local_370._0_8_,aStack_360._M_allocated_capacity + 1);
  }
  local_350._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"-value","");
  ArgsManager::GetSettingsList(&settings_list,&test.super_ArgsManager,(string *)local_350);
  if ((pointer)local_350._0_8_ != pcVar2) {
    operator_delete((void *)local_350._0_8_,local_350._16_8_ + 1);
  }
  VVar4 = (expect->setting).typ;
  if ((VVar4 == VNULL) ||
     ((VVar4 == VBOOL &&
      (iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               compare(&(expect->setting).val,"1"), iVar8 != 0)))) {
    local_438 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_430 = "";
    local_448 = &boost::unit_test::basic_cstring<char_const>::null;
    local_440 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x7a;
    file_00.m_begin = (iterator)&local_438;
    msg_00.m_end = pvVar11;
    msg_00.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_448,
               msg_00);
    local_3c8._8_8_ =
         ((long)settings_list.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)CONCAT71(settings_list.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,
                         settings_list.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                         _M_impl.super__Vector_impl_data._M_start._0_1_) >> 3) * 0x2e8ba2e8ba2e8ba3;
    local_408.m_message.px = (element_type *)((ulong)local_408.m_message.px & 0xffffffffffffff00);
    local_408._0_8_ = &PTR__lazy_ostream_01388f08;
    local_408.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_3f0 = "";
    local_3c8._0_8_ = local_3c8._0_8_ & 0xffffffff00000000;
    local_2d8[0] = settings_list.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_finish ==
                   (pointer)CONCAT71(settings_list.
                                     super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                                     .super__Vector_impl_data._M_start._1_7_,
                                     settings_list.
                                     super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                                     .super__Vector_impl_data._M_start._0_1_);
    local_2d8._8_8_ = (element_type *)0x0;
    local_2d8._16_8_ = (pointer)0x0;
    local_2f8._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_2f8._8_8_ = "";
    local_370._0_8_ = local_3c8 + 8;
    local_350._8_8_ = local_350._8_8_ & 0xffffffffffffff00;
    local_350._0_8_ = &PTR__lazy_ostream_01388f48;
    local_350._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_338._M_allocated_capacity = (size_type)local_370;
    local_390._0_8_ = local_3c8;
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((ulong)l.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388f88;
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)boost::unit_test::lazy_ostream::inst;
    pvVar10 = (iterator)0x1;
    pvVar11 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_2d8,(lazy_ostream *)&local_408,1,2,REQUIRE,0xe36442,
               (size_t)local_2f8,0x7a,local_350,"0U",&l);
    boost::detail::shared_count::~shared_count((shared_count *)(local_2d8 + 0x10));
  }
  else {
    local_458 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_450 = "";
    local_468 = &boost::unit_test::basic_cstring<char_const>::null;
    local_460 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x7c;
    file_01.m_begin = (iterator)&local_458;
    msg_01.m_end = pvVar11;
    msg_01.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_468,
               msg_01);
    local_408.m_message.px = (element_type *)((ulong)local_408.m_message.px & 0xffffffffffffff00);
    local_408._0_8_ = &PTR__lazy_ostream_01388f08;
    local_408.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_3f0 = "";
    lVar9 = (long)settings_list.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            CONCAT71(settings_list.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_start._1_7_,
                     settings_list.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_start._0_1_);
    local_3c8._8_8_ = (lVar9 >> 3) * 0x2e8ba2e8ba2e8ba3;
    local_3c8._0_4_ = 1;
    local_2d8[0] = lVar9 == 0x58;
    local_2d8._8_8_ = (element_type *)0x0;
    local_2d8._16_8_ = (pointer)0x0;
    local_2f8._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_2f8._8_8_ = "";
    local_370._0_8_ = local_3c8 + 8;
    local_350._8_8_ = local_350._8_8_ & 0xffffffffffffff00;
    local_350._0_8_ = &PTR__lazy_ostream_01388f48;
    local_350._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_338._M_allocated_capacity = (size_type)local_370;
    local_390._0_8_ = local_3c8;
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((ulong)l.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388f88;
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)boost::unit_test::lazy_ostream::inst;
    pvVar10 = (iterator)0x1;
    pvVar11 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_2d8,(lazy_ostream *)&local_408,1,2,REQUIRE,0xe36442,
               (size_t)local_2f8,0x7c,local_350,"1U",&l);
    boost::detail::shared_count::~shared_count((shared_count *)(local_2d8 + 0x10));
    local_478 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_470 = "";
    local_488 = &boost::unit_test::basic_cstring<char_const>::null;
    local_480 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x7d;
    file_02.m_begin = (iterator)&local_478;
    msg_02.m_end = pvVar11;
    msg_02.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_488,
               msg_02);
    local_408.m_message.px = (element_type *)((ulong)local_408.m_message.px & 0xffffffffffffff00);
    local_408._0_8_ = &PTR__lazy_ostream_01388f08;
    local_408.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_3f0 = "";
    ::UniValue::write_abi_cxx11_
              ((UniValue *)local_2d8,
               (int)CONCAT71(settings_list.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                             _M_impl.super__Vector_impl_data._M_start._1_7_,
                             settings_list.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                             _M_impl.super__Vector_impl_data._M_start._0_1_),(void *)0x0,0);
    ::UniValue::write_abi_cxx11_((UniValue *)local_2f8,(int)expect,(void *)0x0,0);
    if (local_2d8._8_8_ == local_2f8._8_8_) {
      if ((element_type *)local_2d8._8_8_ == (element_type *)0x0) {
        bVar7 = true;
      }
      else {
        iVar8 = bcmp((void *)local_2d8._0_8_,(void *)local_2f8._0_8_,local_2d8._8_8_);
        bVar7 = iVar8 == 0;
      }
    }
    else {
      bVar7 = false;
    }
    local_370[0] = bVar7;
    local_370._8_8_ = (element_type *)0x0;
    aStack_360._M_allocated_capacity = 0;
    local_390._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_390._8_8_ = "";
    local_350._8_8_ = local_350._8_8_ & 0xffffffffffffff00;
    local_350._0_8_ = &PTR__lazy_ostream_01388fc8;
    local_350._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_338._M_allocated_capacity = (size_type)(local_3c8 + 8);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((ulong)l.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388fc8;
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)boost::unit_test::lazy_ostream::inst;
    pvVar10 = (iterator)0x1;
    pvVar11 = (iterator)0x2;
    local_3c8._0_8_ = (UniValue *)local_2f8;
    local_3c8._8_8_ = (UniValue *)local_2d8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_370,(lazy_ostream *)&local_408,1,2,REQUIRE,0xe36457,
               (size_t)local_390,0x7d,local_350,"expect.setting.write()",&l);
    boost::detail::shared_count::~shared_count((shared_count *)(local_370 + 0x10));
    if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
      operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
    }
    if ((shared_count *)local_2d8._0_8_ != (shared_count *)(local_2d8 + 0x10)) {
      operator_delete((void *)local_2d8._0_8_,(ulong)(local_2d8._16_8_ + 1));
    }
  }
  if (expect->error == (char *)0x0) {
    local_4e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_4e0 = "";
    local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar12 = 0x28b81a;
    file_05.m_end = (iterator)0x84;
    file_05.m_begin = (iterator)&local_4e8;
    msg_05.m_end = pvVar11;
    msg_05.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_4f8,
               msg_05);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(l.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar6);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_408._0_8_ = "success";
    local_408.m_message.px = (element_type *)0xf20922;
    local_350._8_8_ = local_350._8_8_ & 0xffffffffffffff00;
    local_350._0_8_ = &PTR__lazy_ostream_01389048;
    local_350._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_338._M_allocated_capacity = (size_type)&local_408;
    local_508 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_500 = "";
    pvVar10 = (iterator)0x1;
    pvVar11 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&l,(lazy_ostream *)local_350,1,0,WARN,_cVar12,(size_t)&local_508,
               0x84);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &l.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_518 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_510 = "";
    local_528 = &boost::unit_test::basic_cstring<char_const>::null;
    local_520 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0x85;
    file_06.m_begin = (iterator)&local_518;
    msg_06.m_end = pvVar11;
    msg_06.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_528,
               msg_06);
    local_408.m_message.px = (element_type *)((ulong)local_408.m_message.px & 0xffffffffffffff00);
    local_408._0_8_ = &PTR__lazy_ostream_01388f08;
    local_408.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_3f0 = "";
    iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&error,"");
    local_2d8[0] = iVar8 == 0;
    local_2d8._8_8_ = (element_type *)0x0;
    local_2d8._16_8_ = (pointer)0x0;
    local_2f8._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_2f8._8_8_ = "";
    local_350._8_8_ = local_350._8_8_ & 0xffffffffffffff00;
    local_350._0_8_ = &PTR__lazy_ostream_01388fc8;
    local_350._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_338._M_allocated_capacity = (size_type)local_370;
    local_390._0_8_ = "";
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((ulong)l.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389558;
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)boost::unit_test::lazy_ostream::inst;
    pvVar10 = (iterator)0x1;
    pvVar11 = (iterator)0x2;
    local_370._0_8_ = &error;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_2d8,(lazy_ostream *)&local_408,1,2,REQUIRE,0x1104f9f,
               (size_t)local_2f8,0x85,local_350,"\"\"",&l);
    boost::detail::shared_count::~shared_count((shared_count *)(local_2d8 + 0x10));
  }
  else {
    local_498 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_490 = "";
    local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar12 = 0x28b59c;
    file_03.m_end = (iterator)0x81;
    file_03.m_begin = (iterator)&local_498;
    msg_03.m_end = pvVar11;
    msg_03.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_4a8,
               msg_03);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(l.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,!bVar6);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_408._0_8_ = "!success";
    local_408.m_message.px = (element_type *)0xe36478;
    local_350._8_8_ = local_350._8_8_ & 0xffffffffffffff00;
    local_350._0_8_ = &PTR__lazy_ostream_01389048;
    local_350._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_338._M_allocated_capacity = (size_type)&local_408;
    local_4b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_4b0 = "";
    pvVar10 = (iterator)0x1;
    pvVar11 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&l,(lazy_ostream *)local_350,1,0,WARN,_cVar12,(size_t)&local_4b8,
               0x81);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &l.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_4c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_4c0 = "";
    local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0x82;
    file_04.m_begin = (iterator)&local_4c8;
    msg_04.m_end = pvVar11;
    msg_04.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_4d8,
               msg_04);
    local_408.m_message.px = (element_type *)((ulong)local_408.m_message.px & 0xffffffffffffff00);
    local_408._0_8_ = &PTR__lazy_ostream_01388f08;
    local_408.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_3f0 = "";
    __s = expect->error;
    __n = strlen(__s);
    local_3c8._8_8_ =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                   (&error,__s,0,__n);
    local_350[0] = (UniValue *)local_3c8._8_8_ == (UniValue *)0xffffffffffffffff;
    local_350._8_8_ = (pointer)0x0;
    local_350._16_8_ = 0;
    local_2d8[0] = (UniValue *)local_3c8._8_8_ != (UniValue *)0xffffffffffffffff;
    local_2d8._8_8_ = (element_type *)0x0;
    local_2d8._16_8_ = (pointer)0x0;
    boost::detail::shared_count::~shared_count((shared_count *)(local_350 + 0x10));
    local_2f8._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_2f8._8_8_ = "";
    local_370._0_8_ = local_3c8 + 8;
    local_350._8_8_ = local_350._8_8_ & 0xffffffffffffff00;
    local_350._0_8_ = &PTR__lazy_ostream_01388f48;
    local_350._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_338._M_allocated_capacity = (size_type)local_370;
    local_390._0_8_ = &std::__cxx11::string::npos;
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((ulong)l.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01388f48;
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)boost::unit_test::lazy_ostream::inst;
    pvVar10 = (iterator)0x1;
    pvVar11 = (iterator)0x3;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_2d8,(lazy_ostream *)&local_408,1,3,REQUIRE,0xe36479,
               (size_t)local_2f8,0x82,local_350,"std::string::npos",&l);
    boost::detail::shared_count::~shared_count((shared_count *)(local_2d8 + 0x10));
  }
  if (expect->default_string == true) {
    local_538 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_530 = "";
    local_548 = &boost::unit_test::basic_cstring<char_const>::null;
    local_540 = &boost::unit_test::basic_cstring<char_const>::null;
    file_07.m_end = (iterator)0x89;
    file_07.m_begin = (iterator)&local_538;
    msg_07.m_end = pvVar11;
    msg_07.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_548,
               msg_07);
    local_408.m_message.px = (element_type *)((ulong)local_408.m_message.px & 0xffffffffffffff00);
    local_408._0_8_ = &PTR__lazy_ostream_01388f08;
    local_408.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_3f0 = "";
    local_2f8._0_8_ = local_2f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"-value","");
    local_370._0_8_ = local_370 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"zzzzz","");
    ArgsManager::GetArg((string *)local_2d8,&test.super_ArgsManager,(string *)local_2f8,
                        (string *)local_370);
    iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2d8,"zzzzz");
    local_390[0] = iVar8 == 0;
    local_390._8_8_ = (char *)0x0;
    local_390._16_8_ = (sp_counted_base *)0x0;
    local_3c8._8_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_3c8._16_8_ = "";
    local_350._8_8_ = local_350._8_8_ & 0xffffffffffffff00;
    local_350._0_8_ = &PTR__lazy_ostream_01388fc8;
    local_350._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_338._M_allocated_capacity = (size_type)local_3c8;
    local_3d0 = (undefined1  [8])0xe36492;
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((ulong)l.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389498;
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)boost::unit_test::lazy_ostream::inst;
    pvVar10 = (iterator)0x1;
    pvVar11 = (iterator)0x2;
    local_3c8._0_8_ = (UniValue *)local_2d8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_390,(lazy_ostream *)&local_408,1,2,REQUIRE,0xe36498,
               (size_t)(local_3c8 + 8),0x89,local_350,"\"zzzzz\"",&l);
    boost::detail::shared_count::~shared_count((shared_count *)(local_390 + 0x10));
    if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
      operator_delete((void *)local_2d8._0_8_,(ulong)(local_2d8._16_8_ + 1));
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_370 + 0x10)) {
LAB_0028bc5d:
      operator_delete((void *)local_370._0_8_,aStack_360._M_allocated_capacity + 1);
    }
LAB_0028bc6d:
    if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
      operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ + 1);
    }
  }
  else {
    if (expect->string_value != (char *)0x0) {
      local_558 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
      ;
      local_550 = "";
      local_568 = &boost::unit_test::basic_cstring<char_const>::null;
      local_560 = &boost::unit_test::basic_cstring<char_const>::null;
      file_08.m_end = (iterator)0x8b;
      file_08.m_begin = (iterator)&local_558;
      msg_08.m_end = pvVar11;
      msg_08.m_begin = pvVar10;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_568,
                 msg_08);
      local_408.m_message.px = (element_type *)((ulong)local_408.m_message.px & 0xffffffffffffff00);
      local_408._0_8_ = &PTR__lazy_ostream_01388f08;
      local_408.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_3f0 = "";
      local_2f8._0_8_ = local_2f8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"-value","");
      local_370._0_8_ = local_370 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"zzzzz","");
      ArgsManager::GetArg((string *)local_2d8,&test.super_ArgsManager,(string *)local_2f8,
                          (string *)local_370);
      iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8
                      ,expect->string_value);
      local_390[0] = iVar8 == 0;
      local_390._8_8_ = (char *)0x0;
      local_390._16_8_ = (sp_counted_base *)0x0;
      local_3c8._8_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
      ;
      local_3c8._16_8_ = "";
      local_350._8_8_ = local_350._8_8_ & 0xffffffffffffff00;
      local_350._0_8_ = &PTR__lazy_ostream_01388fc8;
      local_350._16_8_ = boost::unit_test::lazy_ostream::inst;
      local_338._M_allocated_capacity = (size_type)local_3c8;
      l.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((ulong)l.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      l.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013894d8;
      l.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)boost::unit_test::lazy_ostream::inst;
      pvVar10 = (iterator)0x1;
      pvVar11 = (iterator)0x2;
      local_3d0 = (undefined1  [8])&expect->string_value;
      local_3c8._0_8_ = (UniValue *)local_2d8;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_390,(lazy_ostream *)&local_408,1,2,REQUIRE,0xe36498,
                 (size_t)(local_3c8 + 8),0x8b,local_350,"expect.string_value",&l);
      boost::detail::shared_count::~shared_count((shared_count *)(local_390 + 0x10));
      if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
        operator_delete((void *)local_2d8._0_8_,(ulong)(local_2d8._16_8_ + 1));
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_370 + 0x10))
      goto LAB_0028bc5d;
      goto LAB_0028bc6d;
    }
    local_578 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_570 = "";
    local_588 = &boost::unit_test::basic_cstring<char_const>::null;
    local_580 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar12 = 0x28bf05;
    file_09.m_end = (iterator)0x8d;
    file_09.m_begin = (iterator)&local_578;
    msg_09.m_end = pvVar11;
    msg_09.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_588,
               msg_09);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(l.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,!bVar6);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_408._0_8_ = "!success";
    local_408.m_message.px = (element_type *)0xe36478;
    local_350._8_8_ = local_350._8_8_ & 0xffffffffffffff00;
    local_350._0_8_ = &PTR__lazy_ostream_01389048;
    local_350._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_338._M_allocated_capacity = (size_type)&local_408;
    local_598 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_590 = "";
    pvVar10 = (iterator)0x1;
    pvVar11 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&l,(lazy_ostream *)local_350,1,0,WARN,_cVar12,(size_t)&local_598,
               0x8d);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &l.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (expect->default_int == true) {
    local_5a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_5a0 = "";
    local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_10.m_end = (iterator)0x91;
    file_10.m_begin = (iterator)&local_5a8;
    msg_10.m_end = pvVar11;
    msg_10.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_5b8,
               msg_10);
    local_408.m_message.px = (element_type *)((ulong)local_408.m_message.px & 0xffffffffffffff00);
    local_408._0_8_ = &PTR__lazy_ostream_01388f08;
    local_408.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_3f0 = "";
    local_2d8._0_8_ = local_2d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"-value","");
    local_3c8._0_8_ = ArgsManager::GetIntArg(&test.super_ArgsManager,(string *)local_2d8,99999);
    local_2f8[0] = (UniValue *)local_3c8._0_8_ == (UniValue *)0x1869f;
    local_3d0._0_4_ = 99999;
    local_2f8._8_8_ = (char *)0x0;
    local_2f8._16_8_ = 0;
    local_370._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_370._8_8_ = "";
    local_390._0_8_ = local_3c8;
    local_350._8_8_ = local_350._8_8_ & 0xffffffffffffff00;
    local_350._0_8_ = &PTR__lazy_ostream_013892a8;
    local_350._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_338._M_allocated_capacity = (size_type)local_390;
    local_3c8._8_8_ = local_3d0;
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((ulong)l.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013890c8;
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)boost::unit_test::lazy_ostream::inst;
    pvVar10 = (iterator)0x1;
    pvVar11 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_2f8,(lazy_ostream *)&local_408,1,2,REQUIRE,0xe364d3,
               (size_t)local_370,0x91,local_350,"99999",&l);
  }
  else {
    if ((expect->int_value).super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_engaged != true) {
      local_5e8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
      ;
      local_5e0 = "";
      local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar12 = 0x28c39f;
      file_12.m_end = (iterator)0x95;
      file_12.m_begin = (iterator)&local_5e8;
      msg_12.m_end = pvVar11;
      msg_12.m_begin = pvVar10;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_5f8,
                 msg_12);
      l.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)(CONCAT71(l.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar6) ^ 1);
      l.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      l.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_408._0_8_ = "!success";
      local_408.m_message.px = (element_type *)0xe36478;
      local_350._8_8_ = local_350._8_8_ & 0xffffffffffffff00;
      local_350._0_8_ = &PTR__lazy_ostream_01389048;
      local_350._16_8_ = boost::unit_test::lazy_ostream::inst;
      local_338._M_allocated_capacity = (size_type)&local_408;
      local_608 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
      ;
      local_600 = "";
      pvVar10 = (iterator)0x1;
      pvVar11 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&l,(lazy_ostream *)local_350,1,0,WARN,_cVar12,
                 (size_t)&local_608,0x95);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &l.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      goto LAB_0028c43f;
    }
    local_5c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_5c0 = "";
    local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_11.m_end = (iterator)0x93;
    file_11.m_begin = (iterator)&local_5c8;
    msg_11.m_end = pvVar11;
    msg_11.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_5d8,
               msg_11);
    local_408.m_message.px = (element_type *)((ulong)local_408.m_message.px & 0xffffffffffffff00);
    local_408._0_8_ = &PTR__lazy_ostream_01388f08;
    local_408.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_3f0 = "";
    local_2d8._0_8_ = local_2d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"-value","");
    local_3c8._0_8_ = ArgsManager::GetIntArg(&test.super_ArgsManager,(string *)local_2d8,99999);
    local_3c8._8_8_ = &expect->int_value;
    local_2f8[0] = (UniValue *)local_3c8._0_8_ ==
                   (UniValue *)
                   (((optional<long> *)local_3c8._8_8_)->super__Optional_base<long,_true,_true>).
                   _M_payload.super__Optional_payload_base<long>._M_payload._M_value;
    local_2f8._8_8_ = (char *)0x0;
    local_2f8._16_8_ = 0;
    local_370._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_370._8_8_ = "";
    local_390._0_8_ = local_3c8;
    local_350._8_8_ = local_350._8_8_ & 0xffffffffffffff00;
    local_350._0_8_ = &PTR__lazy_ostream_013892a8;
    local_350._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_338._M_allocated_capacity = (size_type)local_390;
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((ulong)l.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013892a8;
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)boost::unit_test::lazy_ostream::inst;
    pvVar10 = (iterator)0x1;
    pvVar11 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_2f8,(lazy_ostream *)&local_408,1,2,REQUIRE,0xe364d3,
               (size_t)local_370,0x93,local_350,"*expect.int_value",&l);
  }
  boost::detail::shared_count::~shared_count((shared_count *)(local_2f8 + 0x10));
  if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
    operator_delete((void *)local_2d8._0_8_,(ulong)(local_2d8._16_8_ + 1));
  }
LAB_0028c43f:
  if (expect->default_bool == true) {
    local_618 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_610 = "";
    local_628 = &boost::unit_test::basic_cstring<char_const>::null;
    local_620 = &boost::unit_test::basic_cstring<char_const>::null;
    file_13.m_end = (iterator)0x99;
    file_13.m_begin = (iterator)&local_618;
    msg_13.m_end = pvVar11;
    msg_13.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_628,
               msg_13);
    local_408.m_message.px = (element_type *)((ulong)local_408.m_message.px & 0xffffffffffffff00);
    local_408._0_8_ = &PTR__lazy_ostream_01388f08;
    local_408.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_3f0 = "";
    puVar3 = local_2d8 + 0x10;
    local_2d8._0_8_ = puVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"-value","");
    bVar7 = ArgsManager::GetBoolArg(&test.super_ArgsManager,(string *)local_2d8,false);
    local_3c8[0] = bVar7;
    local_3d0 = (undefined1  [8])((ulong)local_3d0 & 0xffffffffffffff00);
    local_2f8[0] = !bVar7;
    local_2f8._8_8_ = (pointer)0x0;
    local_2f8._16_8_ = 0;
    local_370._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_370._8_8_ = "";
    local_390._0_8_ = local_3c8;
    local_350._8_8_ = local_350._8_8_ & 0xffffffffffffff00;
    local_350._0_8_ = &PTR__lazy_ostream_01389268;
    local_350._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_338._M_allocated_capacity = (size_type)local_390;
    local_3c8._8_8_ = local_3d0;
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((ulong)l.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389268;
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)boost::unit_test::lazy_ostream::inst;
    pvVar10 = (iterator)0x1;
    pvVar11 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_2f8,(lazy_ostream *)&local_408,1,2,REQUIRE,0xe36505,
               (size_t)local_370,0x99,local_350,"false",&l);
    boost::detail::shared_count::~shared_count((shared_count *)(local_2f8 + 0x10));
    if ((undefined1 *)local_2d8._0_8_ != puVar3) {
      operator_delete((void *)local_2d8._0_8_,(ulong)(local_2d8._16_8_ + 1));
    }
    local_638 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_630 = "";
    local_648 = &boost::unit_test::basic_cstring<char_const>::null;
    local_640 = &boost::unit_test::basic_cstring<char_const>::null;
    file_14.m_end = (iterator)0x9a;
    file_14.m_begin = (iterator)&local_638;
    msg_14.m_end = pvVar11;
    msg_14.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_648,
               msg_14);
    local_408.m_message.px = (element_type *)((ulong)local_408.m_message.px & 0xffffffffffffff00);
    local_408._0_8_ = &PTR__lazy_ostream_01388f08;
    local_408.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_3f0 = "";
    local_2d8._0_8_ = puVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"-value","");
    bVar7 = ArgsManager::GetBoolArg(&test.super_ArgsManager,(string *)local_2d8,true);
    local_3c8[0] = bVar7;
    local_3d0[0] = 1;
    local_2f8[0] = bVar7;
    local_2f8._8_8_ = (char *)0x0;
    local_2f8._16_8_ = 0;
    local_370._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_370._8_8_ = "";
    local_390._0_8_ = local_3c8;
    local_350._8_8_ = local_350._8_8_ & 0xffffffffffffff00;
    local_350._0_8_ = &PTR__lazy_ostream_01389268;
    local_350._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_338._M_allocated_capacity = (size_type)local_390;
    local_3c8._8_8_ = local_3d0;
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((ulong)l.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389268;
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)boost::unit_test::lazy_ostream::inst;
    pvVar10 = (iterator)0x1;
    pvVar11 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_2f8,(lazy_ostream *)&local_408,1,2,REQUIRE,0xe36526,
               (size_t)local_370,0x9a,local_350,"true",&l);
    boost::detail::shared_count::~shared_count((shared_count *)(local_2f8 + 0x10));
    if ((undefined1 *)local_2d8._0_8_ != puVar3) {
      operator_delete((void *)local_2d8._0_8_,(ulong)(local_2d8._16_8_ + 1));
    }
  }
  else if ((expect->bool_value).super__Optional_base<bool,_true,_true>._M_payload.
           super__Optional_payload_base<bool>._M_engaged == true) {
    local_658 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_650 = "";
    local_668 = &boost::unit_test::basic_cstring<char_const>::null;
    local_660 = &boost::unit_test::basic_cstring<char_const>::null;
    file_15.m_end = (iterator)0x9c;
    file_15.m_begin = (iterator)&local_658;
    msg_15.m_end = pvVar11;
    msg_15.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_668,
               msg_15);
    local_408.m_message.px = (element_type *)((ulong)local_408.m_message.px & 0xffffffffffffff00);
    local_408._0_8_ = &PTR__lazy_ostream_01388f08;
    local_408.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_3f0 = "";
    puVar3 = local_2d8 + 0x10;
    local_2d8._0_8_ = puVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"-value","");
    bVar7 = ArgsManager::GetBoolArg(&test.super_ArgsManager,(string *)local_2d8,false);
    poVar1 = &expect->bool_value;
    local_3c8[0] = bVar7;
    local_2f8[0] = (poVar1->super__Optional_base<bool,_true,_true>)._M_payload.
                   super__Optional_payload_base<bool>._M_payload._M_value == bVar7;
    local_2f8._8_8_ = (pointer)0x0;
    local_2f8._16_8_ = 0;
    local_370._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_370._8_8_ = "";
    local_390._0_8_ = local_3c8;
    local_350._8_8_ = local_350._8_8_ & 0xffffffffffffff00;
    local_350._0_8_ = &PTR__lazy_ostream_01389268;
    local_350._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_338._M_allocated_capacity = (size_type)local_390;
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((ulong)l.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389268;
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)boost::unit_test::lazy_ostream::inst;
    pvVar10 = (iterator)0x1;
    pvVar11 = (iterator)0x2;
    local_3c8._8_8_ = poVar1;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_2f8,(lazy_ostream *)&local_408,1,2,REQUIRE,0xe36505,
               (size_t)local_370,0x9c,local_350,"*expect.bool_value",&l);
    boost::detail::shared_count::~shared_count((shared_count *)(local_2f8 + 0x10));
    if ((undefined1 *)local_2d8._0_8_ != puVar3) {
      operator_delete((void *)local_2d8._0_8_,(ulong)(local_2d8._16_8_ + 1));
    }
    local_678 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_670 = "";
    local_688 = &boost::unit_test::basic_cstring<char_const>::null;
    local_680 = &boost::unit_test::basic_cstring<char_const>::null;
    file_16.m_end = (iterator)0x9d;
    file_16.m_begin = (iterator)&local_678;
    msg_16.m_end = pvVar11;
    msg_16.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_688,
               msg_16);
    local_408.m_message.px = (element_type *)((ulong)local_408.m_message.px & 0xffffffffffffff00);
    local_408._0_8_ = &PTR__lazy_ostream_01388f08;
    local_408.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_3f0 = "";
    local_2d8._0_8_ = puVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"-value","");
    bVar7 = ArgsManager::GetBoolArg(&test.super_ArgsManager,(string *)local_2d8,true);
    local_3c8[0] = bVar7;
    local_2f8[0] = (poVar1->super__Optional_base<bool,_true,_true>)._M_payload.
                   super__Optional_payload_base<bool>._M_payload._M_value == bVar7;
    local_2f8._8_8_ = (char *)0x0;
    local_2f8._16_8_ = 0;
    local_370._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_370._8_8_ = "";
    local_390._0_8_ = local_3c8;
    local_350._8_8_ = local_350._8_8_ & 0xffffffffffffff00;
    local_350._0_8_ = &PTR__lazy_ostream_01389268;
    local_350._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_338._M_allocated_capacity = (size_type)local_390;
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((ulong)l.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389268;
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)boost::unit_test::lazy_ostream::inst;
    pvVar10 = (iterator)0x1;
    pvVar11 = (iterator)0x2;
    local_3c8._8_8_ = poVar1;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_2f8,(lazy_ostream *)&local_408,1,2,REQUIRE,0xe36526,
               (size_t)local_370,0x9d,local_350,"*expect.bool_value",&l);
    boost::detail::shared_count::~shared_count((shared_count *)(local_2f8 + 0x10));
    if ((undefined1 *)local_2d8._0_8_ != puVar3) {
      operator_delete((void *)local_2d8._0_8_,(ulong)(local_2d8._16_8_ + 1));
    }
  }
  else {
    local_698 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_690 = "";
    local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_6a0 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar12 = 0x28cc02;
    file_17.m_end = (iterator)0x9f;
    file_17.m_begin = (iterator)&local_698;
    msg_17.m_end = pvVar11;
    msg_17.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_6a8,
               msg_17);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(CONCAT71(l.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar6) ^ 1);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_408._0_8_ = "!success";
    local_408.m_message.px = (element_type *)0xe36478;
    local_350._8_8_ = local_350._8_8_ & 0xffffffffffffff00;
    local_350._0_8_ = &PTR__lazy_ostream_01389048;
    local_350._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_338._M_allocated_capacity = (size_type)&local_408;
    local_6b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_6b0 = "";
    pvVar10 = (iterator)0x1;
    pvVar11 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&l,(lazy_ostream *)local_350,1,0,WARN,_cVar12,(size_t)&local_6b8,
               0x9f);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &l.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if ((expect->list_value).
      super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_engaged == true) {
    local_350._0_8_ = local_350 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"-value","");
    ArgsManager::GetArgs(&l,&test.super_ArgsManager,(string *)local_350);
    if ((undefined1 *)local_350._0_8_ != local_350 + 0x10) {
      operator_delete((void *)local_350._0_8_,(ulong)(local_350._16_8_ + 1));
    }
    local_6c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_6c0 = "";
    local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_18.m_end = (iterator)0xa4;
    file_18.m_begin = (iterator)&local_6c8;
    msg_18.m_end = pvVar11;
    msg_18.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_6d8,
               msg_18);
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              (&local_408,(equal_coll_impl *)local_2d8,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )l.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )l.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                &(expect->list_value).
                 super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_payload._M_value.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl,
               *(pointer *)
                ((long)&(expect->list_value).
                        super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_payload._M_value.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                + 8));
    local_350._8_8_ = local_350._8_8_ & 0xffffffffffffff00;
    local_350._0_8_ = &PTR__lazy_ostream_01388f08;
    local_350._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_338._0_8_ = "";
    local_6e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_6e0 = "";
    boost::test_tools::tt_detail::report_assertion
              (&local_408,(lazy_ostream *)local_350,1,0xd,4,0xf54cc7,(size_t)&local_6e8,0xa4,
               "l.end()","expect.list_value->begin()","expect.list_value->end()");
    boost::detail::shared_count::~shared_count(&local_408.m_message.pn);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&l);
  }
  else {
    local_6f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_6f0 = "";
    local_708 = &boost::unit_test::basic_cstring<char_const>::null;
    local_700 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar12 = 0x28ce43;
    file_19.m_end = (iterator)0xa6;
    file_19.m_begin = (iterator)&local_6f8;
    msg_19.m_end = pvVar11;
    msg_19.m_begin = pvVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_708,
               msg_19);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(CONCAT71(l.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar6) ^ 1);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_408._0_8_ = "!success";
    local_408.m_message.px = (element_type *)0xe36478;
    local_350._8_8_ = local_350._8_8_ & 0xffffffffffffff00;
    local_350._0_8_ = &PTR__lazy_ostream_01389048;
    local_350._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_338._M_allocated_capacity = (size_type)&local_408;
    local_718 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_710 = "";
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&l,(lazy_ostream *)local_350,1,0,WARN,_cVar12,(size_t)&local_718,
               0xa6);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &l.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&settings_list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error._M_dataplus._M_p != &error.field_2) {
    operator_delete(error._M_dataplus._M_p,
                    CONCAT71(error.field_2._M_allocated_capacity._1_7_,error.field_2._M_local_buf[0]
                            ) + 1);
  }
  ArgsManager::~ArgsManager(&test.super_ArgsManager);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar5) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CheckValue(unsigned int flags, const char* arg, const Expect& expect)
    {
        TestArgsManager test;
        test.SetupArgs({{"-value", flags}});
        const char* argv[] = {"ignored", arg};
        std::string error;
        bool success = test.ParseParameters(arg ? 2 : 1, argv, error);

        BOOST_CHECK_EQUAL(test.GetSetting("-value").write(), expect.setting.write());
        auto settings_list = test.GetSettingsList("-value");
        if (expect.setting.isNull() || expect.setting.isFalse()) {
            BOOST_CHECK_EQUAL(settings_list.size(), 0U);
        } else {
            BOOST_CHECK_EQUAL(settings_list.size(), 1U);
            BOOST_CHECK_EQUAL(settings_list[0].write(), expect.setting.write());
        }

        if (expect.error) {
            BOOST_CHECK(!success);
            BOOST_CHECK_NE(error.find(expect.error), std::string::npos);
        } else {
            BOOST_CHECK(success);
            BOOST_CHECK_EQUAL(error, "");
        }

        if (expect.default_string) {
            BOOST_CHECK_EQUAL(test.GetArg("-value", "zzzzz"), "zzzzz");
        } else if (expect.string_value) {
            BOOST_CHECK_EQUAL(test.GetArg("-value", "zzzzz"), expect.string_value);
        } else {
            BOOST_CHECK(!success);
        }

        if (expect.default_int) {
            BOOST_CHECK_EQUAL(test.GetIntArg("-value", 99999), 99999);
        } else if (expect.int_value) {
            BOOST_CHECK_EQUAL(test.GetIntArg("-value", 99999), *expect.int_value);
        } else {
            BOOST_CHECK(!success);
        }

        if (expect.default_bool) {
            BOOST_CHECK_EQUAL(test.GetBoolArg("-value", false), false);
            BOOST_CHECK_EQUAL(test.GetBoolArg("-value", true), true);
        } else if (expect.bool_value) {
            BOOST_CHECK_EQUAL(test.GetBoolArg("-value", false), *expect.bool_value);
            BOOST_CHECK_EQUAL(test.GetBoolArg("-value", true), *expect.bool_value);
        } else {
            BOOST_CHECK(!success);
        }

        if (expect.list_value) {
            auto l = test.GetArgs("-value");
            BOOST_CHECK_EQUAL_COLLECTIONS(l.begin(), l.end(), expect.list_value->begin(), expect.list_value->end());
        } else {
            BOOST_CHECK(!success);
        }
    }